

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O2

void Ssw_ManSweepTransferDyn(Ssw_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  uint *puVar5;
  Aig_Man_t *pAVar6;
  Aig_Obj_t *pAVar7;
  int iVar8;
  
  iVar8 = 0;
  do {
    pAVar6 = p->pAig;
    if (pAVar6->vCis->nSize <= iVar8) {
      iVar8 = 1;
      do {
        if (p->nFrames <= iVar8) {
          iVar2 = Ssw_SmlNumFrames(p->pSml);
          for (; iVar8 < iVar2; iVar8 = iVar8 + 1) {
            for (iVar3 = 0; iVar3 < p->pAig->nTruePis; iVar3 = iVar3 + 1) {
              pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,iVar3);
              Ssw_SmlAssignRandomFrame(p->pSml,pAVar7,iVar8);
            }
          }
          return;
        }
        for (iVar2 = 0; iVar2 < pAVar6->nTruePis; iVar2 = iVar2 + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vCis,iVar2);
          pAVar7 = p->pNodeToFrames[pAVar4->Id * p->nFrames + iVar8];
          if (((ulong)pAVar7 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObjFraig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                          ,0xed,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
          }
          if ((*(uint *)&pAVar7->field_0x18 & 7) != 2) {
            __assert_fail("Aig_ObjIsCi(pObjFraig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                          ,0xee,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
          }
          pVVar1 = p->vSimInfo;
          iVar3 = Aig_ObjCioId(pAVar7);
          puVar5 = (uint *)Vec_PtrEntry(pVVar1,iVar3);
          Ssw_SmlObjSetWord(p->pSml,pAVar4,*puVar5,0,iVar8);
          pAVar6 = p->pAig;
        }
        iVar8 = iVar8 + 1;
      } while( true );
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vCis,iVar8);
    pAVar7 = p->pNodeToFrames[(long)pAVar4->Id * (long)p->nFrames];
    if (pAVar7 == (Aig_Obj_t *)((ulong)p->pFrames->pConst1 ^ 1)) {
      Ssw_SmlObjAssignConst(p->pSml,pAVar4,0,0);
    }
    else {
      if (((ulong)pAVar7 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObjFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                      ,0xe2,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
      }
      if ((*(uint *)&pAVar7->field_0x18 & 7) != 2) {
        __assert_fail("Aig_ObjIsCi(pObjFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                      ,0xe3,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
      }
      pVVar1 = p->vSimInfo;
      iVar2 = Aig_ObjCioId(pAVar7);
      puVar5 = (uint *)Vec_PtrEntry(pVVar1,iVar2);
      Ssw_SmlObjSetWord(p->pSml,pAVar4,*puVar5,0,0);
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void Ssw_ManSweepTransferDyn( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjFraig;
    unsigned * pInfo;
    int i, f, nFrames;

    // transfer simulation information
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pObjFraig = Ssw_ObjFrame( p, pObj, 0 );
        if ( pObjFraig == Aig_ManConst0(p->pFrames) )
        {
            Ssw_SmlObjAssignConst( p->pSml, pObj, 0, 0 );
            continue;
        }
        assert( !Aig_IsComplement(pObjFraig) );
        assert( Aig_ObjIsCi(pObjFraig) );
        pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObjFraig) );
        Ssw_SmlObjSetWord( p->pSml, pObj, pInfo[0], 0, 0 );
    }
    // set random simulation info for the second frame
    for ( f = 1; f < p->nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFraig = Ssw_ObjFrame( p, pObj, f );
            assert( !Aig_IsComplement(pObjFraig) );
            assert( Aig_ObjIsCi(pObjFraig) );
            pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObjFraig) );
            Ssw_SmlObjSetWord( p->pSml, pObj, pInfo[0], 0, f );
        }
    }
    // create random info
    nFrames = Ssw_SmlNumFrames( p->pSml );
    for ( ; f < nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_SmlAssignRandomFrame( p->pSml, pObj, f );
    }
}